

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.h
# Opt level: O2

void __thiscall
cmQtAutoGeneratorMocUic::BaseSettingsT::BaseSettingsT(BaseSettingsT *this,FileSystem *fileSystem)

{
  this->MultiConfig = false;
  this->IncludeProjectDirsBefore = false;
  this->QtVersionMajor = 4;
  this->NumThreads = 1;
  (this->ProjectSourceDir)._M_dataplus._M_p = (pointer)&(this->ProjectSourceDir).field_2;
  (this->ProjectSourceDir)._M_string_length = 0;
  (this->ProjectSourceDir).field_2._M_local_buf[0] = '\0';
  (this->ProjectBinaryDir)._M_dataplus._M_p = (pointer)&(this->ProjectBinaryDir).field_2;
  (this->ProjectBinaryDir)._M_string_length = 0;
  (this->ProjectBinaryDir).field_2._M_local_buf[0] = '\0';
  (this->CurrentSourceDir)._M_dataplus._M_p = (pointer)&(this->CurrentSourceDir).field_2;
  (this->CurrentSourceDir)._M_string_length = 0;
  (this->CurrentSourceDir).field_2._M_local_buf[0] = '\0';
  (this->CurrentBinaryDir)._M_dataplus._M_p = (pointer)&(this->CurrentBinaryDir).field_2;
  (this->CurrentBinaryDir)._M_string_length = 0;
  (this->CurrentBinaryDir).field_2._M_local_buf[0] = '\0';
  (this->AutogenBuildDir)._M_dataplus._M_p = (pointer)&(this->AutogenBuildDir).field_2;
  (this->AutogenBuildDir)._M_string_length = 0;
  (this->AutogenBuildDir).field_2._M_local_buf[0] = '\0';
  (this->AutogenIncludeDir)._M_dataplus._M_p = (pointer)&(this->AutogenIncludeDir).field_2;
  (this->AutogenIncludeDir)._M_string_length = 0;
  (this->AutogenIncludeDir).field_2._M_local_buf[0] = '\0';
  (this->HeaderExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeaderExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeaderExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->FileSys = fileSystem;
  return;
}

Assistant:

BaseSettingsT(FileSystem* fileSystem)
      : MultiConfig(false)
      , IncludeProjectDirsBefore(false)
      , QtVersionMajor(4)
      , NumThreads(1)
      , FileSys(fileSystem)
    {
    }